

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_setlocal(lua_State *L)

{
  undefined8 L_00;
  int32_t iVar1;
  int iVar2;
  lua_State *plVar3;
  char *str;
  TValue *tv;
  lua_Debug ar;
  lua_State *L1;
  lua_State *plStack_40;
  int arg;
  lua_State *L_local;
  TValue *local_30;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  int iStack_24;
  char *local_20;
  TValue *local_18;
  char local_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  int iStack_c;
  
  plStack_40 = L;
  plVar3 = getthread(L,(int *)((long)&L1 + 4));
  ar._112_8_ = plVar3;
  iVar1 = lj_lib_checkint(plStack_40,L1._4_4_ + 1);
  iVar2 = lua_getstack(plVar3,iVar1,(lua_Debug *)&tv);
  if (iVar2 == 0) {
    lj_err_arg(plStack_40,L1._4_4_ + 1,LJ_ERR_LVLRNG);
  }
  L_local = (lua_State *)lj_lib_checkany(plStack_40,L1._4_4_ + 3);
  plVar3 = plStack_40;
  L_00 = ar._112_8_;
  local_30 = *(TValue **)(ar._112_8_ + 0x28);
  *(TValue **)(ar._112_8_ + 0x28) = local_30 + 1;
  local_28 = ar.short_src[0x38];
  cStack_27 = ar.short_src[0x39];
  cStack_26 = ar.short_src[0x3a];
  cStack_25 = ar.short_src[0x3b];
  iStack_24 = ar.i_ci;
  *local_30 = *(TValue *)L_local;
  local_10 = ar.short_src[0x38];
  cStack_f = ar.short_src[0x39];
  cStack_e = ar.short_src[0x3a];
  cStack_d = ar.short_src[0x3b];
  iStack_c = ar.i_ci;
  local_20 = "copy of dead GC object";
  local_18 = local_30;
  iVar1 = lj_lib_checkint(plStack_40,L1._4_4_ + 2);
  str = lua_setlocal((lua_State *)L_00,(lua_Debug *)&tv,iVar1);
  lua_pushstring(plVar3,str);
  return 1;
}

Assistant:

LJLIB_CF(debug_setlocal)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  TValue *tv;
  if (!lua_getstack(L1, lj_lib_checkint(L, arg+1), &ar))
    lj_err_arg(L, arg+1, LJ_ERR_LVLRNG);
  tv = lj_lib_checkany(L, arg+3);
  copyTV(L1, L1->top++, tv);
  lua_pushstring(L, lua_setlocal(L1, &ar, lj_lib_checkint(L, arg+2)));
  return 1;
}